

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O0

void ihevc_sao_band_offset_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,WORD32 sao_band_pos_u,WORD32 sao_band_pos_v,
               WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht)

{
  byte bVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 *in_R8;
  int in_R9D;
  int in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  WORD32 band_table_u [32];
  WORD32 band_shift;
  char local_160;
  int local_15c;
  long local_158;
  int local_144;
  int local_140;
  int local_13c;
  int aiStack_138 [32];
  int aiStack_b8 [20];
  WORD8 *pi1_sao_offset;
  WORD32 band_idx;
  WORD32 col;
  WORD32 row;
  WORD32 i;
  undefined4 local_30;
  int local_2c;
  int local_c;
  long local_8;
  
  for (local_140 = 0; local_140 < in_stack_00000028; local_140 = local_140 + 1) {
    *(undefined1 *)(in_RDX + (local_140 << 1)) =
         *(undefined1 *)(in_RDI + (local_140 * in_ESI + in_stack_00000020 + -2));
    *(undefined1 *)(in_RDX + (local_140 * 2 + 1)) =
         *(undefined1 *)(in_RDI + (local_140 * in_ESI + in_stack_00000020 + -1));
  }
  *in_R8 = *(undefined1 *)(in_RCX + (in_stack_00000020 + -2));
  in_R8[1] = *(undefined1 *)(in_RCX + (in_stack_00000020 + -1));
  for (local_144 = 0; local_144 < in_stack_00000020; local_144 = local_144 + 1) {
    *(undefined1 *)(in_RCX + local_144) =
         *(undefined1 *)(in_RDI + ((in_stack_00000028 + -1) * in_ESI + local_144));
  }
  local_30 = 3;
  for (local_13c = 0; local_13c < 0x20; local_13c = local_13c + 1) {
    aiStack_b8[local_13c] = 0;
    aiStack_138[local_13c] = 0;
  }
  local_2c = in_R9D;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_13c = 0; local_13c < 4; local_13c = local_13c + 1) {
    aiStack_b8[(int)(local_13c + local_2c & 0x1f)] = local_13c + 1;
    aiStack_138[(int)(local_13c + in_stack_00000008 & 0x1f)] = local_13c + 1;
  }
  for (local_140 = 0; local_140 < in_stack_00000028; local_140 = local_140 + 1) {
    for (local_144 = 0; local_144 < in_stack_00000020; local_144 = local_144 + 1) {
      if (local_144 % 2 == 0) {
        local_158 = in_stack_00000010;
      }
      else {
        local_158 = in_stack_00000018;
      }
      bVar1 = (byte)local_30;
      if (local_144 % 2 == 0) {
        local_15c = aiStack_b8[(int)(uint)*(byte *)(local_8 + local_144) >> (bVar1 & 0x1f)];
      }
      else {
        local_15c = aiStack_138[(int)(uint)*(byte *)(local_8 + local_144) >> (bVar1 & 0x1f)];
      }
      if ((1 << (bVar1 + 5 & 0x1f)) + -1 <
          (int)((uint)*(byte *)(local_8 + local_144) + (int)*(char *)(local_158 + local_15c))) {
        local_160 = (char)(1 << (bVar1 + 5 & 0x1f)) + -1;
      }
      else if ((int)((uint)*(byte *)(local_8 + local_144) + (int)*(char *)(local_158 + local_15c)) <
               0) {
        local_160 = '\0';
      }
      else {
        local_160 = *(char *)(local_8 + local_144) + *(char *)(local_158 + local_15c);
      }
      *(char *)(local_8 + local_144) = local_160;
    }
    local_8 = local_8 + local_c;
  }
  return;
}

Assistant:

void ihevc_sao_band_offset_chroma(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  WORD32 sao_band_pos_u,
                                  WORD32 sao_band_pos_v,
                                  WORD8 *pi1_sao_offset_u,
                                  WORD8 *pi1_sao_offset_v,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 band_shift;
    WORD32 band_table_u[NUM_BAND_TABLE];
    WORD32 band_table_v[NUM_BAND_TABLE];
    WORD32 i;
    WORD32 row, col;

    /* Updating left and top and top-left */
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[2 * row] = pu1_src[row * src_strd + (wd - 2)];
        pu1_src_left[2 * row + 1] = pu1_src[row * src_strd + (wd - 1)];
    }
    pu1_src_top_left[0] = pu1_src_top[wd - 2];
    pu1_src_top_left[1] = pu1_src_top[wd - 1];
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    band_shift = BIT_DEPTH_CHROMA - 5;
    for(i = 0; i < NUM_BAND_TABLE; i++)
    {
        band_table_u[i] = 0;
        band_table_v[i] = 0;
    }
    for(i = 0; i < 4; i++)
    {
        band_table_u[(i + sao_band_pos_u) & 31] = i + 1;
        band_table_v[(i + sao_band_pos_v) & 31] = i + 1;
    }

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            WORD32 band_idx;
            WORD8 *pi1_sao_offset;

            pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;
            band_idx = (0 == col % 2) ? band_table_u[pu1_src[col] >> band_shift] : band_table_v[pu1_src[col] >> band_shift];
            pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[band_idx], 0, (1 << (band_shift + 5)) - 1);
        }
        pu1_src += src_strd;
    }
}